

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute.h
# Opt level: O3

void __thiscall
c74::min::
attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
::attribute_threadsafe_helper
          (attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
           *this,attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
                 *an_attribute)

{
  t_qelem *ptVar1;
  
  this->m_attribute = an_attribute;
  (this->m_value).super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_value).super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptVar1 = (t_qelem *)
           qelem_new(this,
                     attribute_threadsafe_helper_qfn<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)1>
                    );
  this->m_qelem = ptVar1;
  return;
}

Assistant:

explicit attribute_threadsafe_helper(attribute<T, threadsafe::no, limit_type, repetitions>* an_attribute)
        : m_attribute(an_attribute)
    {
        m_qelem = (max::t_qelem*)max::qelem_new(this, (max::method)attribute_threadsafe_helper_qfn<T, threadsafe::no, limit_type, repetitions>);
    }